

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QModelIndex * __thiscall QTreeView::indexBelow(QTreeView *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  QTreeViewPrivate *pQVar3;
  long lVar4;
  qsizetype qVar5;
  const_reference pQVar6;
  QModelIndex *in_RDX;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeViewPrivate *unaff_retaddr;
  int i;
  QTreeViewPrivate *d;
  QModelIndex firstColumnIndex;
  qsizetype in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QModelIndex *in_stack_ffffffffffffffa8;
  QAbstractItemViewPrivate *this_00;
  undefined1 *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  QModelIndex *_index;
  
  _index = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = d_func((QTreeView *)0x8f3094);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(this_00,in_stack_ffffffffffffffa8);
  if (bVar1) {
    QAbstractItemViewPrivate::executePostedLayout
              ((QAbstractItemViewPrivate *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    iVar2 = QTreeViewPrivate::viewIndex(unaff_retaddr,_index);
    lVar4 = (long)(iVar2 + 1);
    qVar5 = QList<QTreeViewItem>::size(&pQVar3->viewItems);
    if (lVar4 < qVar5) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
      local_20._0_4_ = (pQVar6->index).r;
      local_20._4_4_ = (pQVar6->index).c;
      local_18 = (undefined1 *)(pQVar6->index).i;
      local_10.ptr = (pQVar6->index).m.ptr;
      QModelIndex::row((QModelIndex *)&local_20);
      QModelIndex::column(in_RDX);
      QModelIndex::sibling((QModelIndex *)this_00,(int)((ulong)lVar4 >> 0x20),(int)lVar4);
    }
    else {
      QModelIndex::QModelIndex((QModelIndex *)0x8f3112);
    }
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0x8f30b6);
  }
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) == _index) {
    return (QModelIndex *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTreeView::indexBelow(const QModelIndex &index) const
{
    Q_D(const QTreeView);
    if (!d->isIndexValid(index))
        return QModelIndex();
    d->executePostedLayout();
    int i = d->viewIndex(index);
    if (++i >= d->viewItems.size())
        return QModelIndex();
    const QModelIndex firstColumnIndex = d->viewItems.at(i).index;
    return firstColumnIndex.sibling(firstColumnIndex.row(), index.column());
}